

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticencoder.cpp
# Opt level: O0

void __thiscall ArithmeticEncoder::writeByte(ArithmeticEncoder *this,U8 sym)

{
  uint uVar1;
  uint uVar2;
  U32 init_base;
  U8 sym_local;
  ArithmeticEncoder *this_local;
  
  uVar1 = this->base;
  uVar2 = this->length >> 8;
  this->length = uVar2;
  this->base = sym * uVar2 + this->base;
  if (this->base < uVar1) {
    propagate_carry(this);
  }
  if (this->length < 0x1000000) {
    renorm_enc_interval(this);
  }
  return;
}

Assistant:

void ArithmeticEncoder::writeByte(U8 sym)
{
  U32 init_base = base;
  base += (U32)(sym) * (length >>= 8);           // new interval base and length

  if (init_base > base) propagate_carry();                 // overflow = carry
  if (length < AC__MinLength) renorm_enc_interval();        // renormalization
}